

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaParser::parse_polymesh(XMLElement *xml,PolymeshInfo *polymesh)

{
  undefined8 uVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  double dVar5;
  bool bVar6;
  __type _Var7;
  bool bVar8;
  char cVar9;
  int iVar10;
  XMLElement *pXVar11;
  XMLElement *pXVar12;
  char *pcVar13;
  XMLElement *this;
  mapped_type *pmVar14;
  iterator iVar15;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar16;
  byte bVar17;
  long lVar18;
  vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *this_00;
  size_t i;
  ulong uVar19;
  long lVar20;
  size_type __new_size;
  size_type sVar21;
  size_t i_1;
  ulong uVar22;
  bool bVar23;
  long local_2d0;
  float f;
  double dStack_2c0;
  pointer local_2b8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_2b0;
  string s;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  long local_258;
  long local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  string vertices_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  arr_sources;
  size_t index;
  stringstream ss;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(polymesh->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(polymesh->super_Instance).name);
  (polymesh->super_Instance).type = POLYMESH;
  pXVar11 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"mesh");
  if (pXVar11 != (XMLElement *)0x0) {
    arr_sources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &arr_sources._M_t._M_impl.super__Rb_tree_header._M_header;
    arr_sources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    arr_sources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    arr_sources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         arr_sources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pXVar12 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"source");
    while (pXVar12 != (XMLElement *)0x0) {
      pcVar13 = tinyxml2::XMLElement::Attribute(pXVar12,"id",(char *)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertices_id,pcVar13,(allocator<char> *)&ss);
      this = tinyxml2::XMLNode::FirstChildElement(&pXVar12->super_XMLNode,"float_array");
      if (this != (XMLElement *)0x0) {
        vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar13 = tinyxml2::XMLElement::GetText(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,pcVar13,(allocator<char> *)&ss);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&s,_S_out|_S_in);
        iVar10 = tinyxml2::XMLElement::IntAttribute(this,"count");
        lVar18 = (long)iVar10;
        while (bVar23 = lVar18 != 0, lVar18 = lVar18 + -1, bVar23) {
          std::istream::_M_extract<float>((float *)&ss);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&vertices,&f);
        }
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](&arr_sources,&vertices_id);
        std::vector<float,_std::allocator<float>_>::operator=
                  (pmVar14,(vector<float,_std::allocator<float>_> *)&vertices);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::__cxx11::string::~string((string *)&s);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&vertices);
      }
      pXVar12 = tinyxml2::XMLNode::NextSiblingElement(&pXVar12->super_XMLNode,"source");
      std::__cxx11::string::~string((string *)&vertices_id);
    }
    vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices_id._M_dataplus._M_p = (pointer)&vertices_id.field_2;
    vertices_id._M_string_length = 0;
    vertices_id.field_2._M_local_buf[0] = '\0';
    pXVar12 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"vertices");
    if (pXVar12 != (XMLElement *)0x0) {
      tinyxml2::XMLElement::Attribute(pXVar12,"id",(char *)0x0);
      std::__cxx11::string::assign((char *)&vertices_id);
      pXVar12 = tinyxml2::XMLNode::FirstChildElement(&pXVar12->super_XMLNode,"input");
      while( true ) {
        if (pXVar12 == (XMLElement *)0x0) break;
        pcVar13 = tinyxml2::XMLElement::Attribute(pXVar12,"semantic",(char *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,pcVar13,(allocator<char> *)&s);
        bVar23 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ss,"POSITION");
        if (bVar23) {
          pcVar13 = tinyxml2::XMLElement::Attribute(pXVar12,"source",(char *)0x0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&s,pcVar13 + 1,(allocator<char> *)&f);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::find(&arr_sources._M_t,&s);
          if ((_Rb_tree_header *)iVar15._M_node == &arr_sources._M_t._M_impl.super__Rb_tree_header)
          goto LAB_00175933;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[](&arr_sources,&s);
          pfVar2 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pfVar3 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar19 < (ulong)((long)pfVar2 - (long)pfVar3 >> 2); uVar19 = uVar19 + 3)
          {
            pfVar4 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_2b8 = (pointer)(double)pfVar4[uVar19 + 2];
            uVar1 = *(undefined8 *)(pfVar4 + uVar19);
            dStack_2c0 = (double)(float)((ulong)uVar1 >> 0x20);
            _f = (pointer)(double)(float)uVar1;
            std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                      (&vertices,(value_type *)&f);
          }
          std::__cxx11::string::~string((string *)&s);
        }
        pXVar12 = tinyxml2::XMLNode::NextSiblingElement(&pXVar12->super_XMLNode,"input");
        std::__cxx11::string::~string((string *)&ss);
      }
      pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"polylist");
      if (pXVar11 == (XMLElement *)0x0) {
LAB_001758fd:
        std::__cxx11::string::~string((string *)&vertices_id);
        std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
                  (&vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                  );
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::~_Rb_tree(&arr_sources._M_t);
        return;
      }
      pXVar12 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"input");
      local_2b0 = &polymesh->vertices;
      local_258 = 0;
      cVar9 = '\0';
      local_250 = 0;
      bVar8 = false;
      local_2d0 = 0;
      bVar23 = false;
      while( true ) {
        if (pXVar12 == (XMLElement *)0x0) break;
        pcVar13 = tinyxml2::XMLElement::Attribute(pXVar12,"semantic",(char *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,pcVar13,(allocator<char> *)&s);
        pcVar13 = tinyxml2::XMLElement::Attribute(pXVar12,"source",(char *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,pcVar13 + 1,(allocator<char> *)&f);
        iVar10 = tinyxml2::XMLElement::IntAttribute(pXVar12,"offset");
        lVar18 = (long)iVar10;
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,"VERTEX");
        if (bVar6) {
          _Var7 = std::operator==(&s,&vertices_id);
          if (!_Var7) goto LAB_00175933;
          std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
                    (local_2b0,
                     ((long)vertices.
                            super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x18);
          bVar23 = true;
          std::
          __copy_move_a<false,__gnu_cxx::__normal_iterator<CMU462::Vector3D*,std::vector<CMU462::Vector3D,std::allocator<CMU462::Vector3D>>>,__gnu_cxx::__normal_iterator<CMU462::Vector3D*,std::vector<CMU462::Vector3D,std::allocator<CMU462::Vector3D>>>>
                    ((__normal_iterator<CMU462::Vector3D_*,_std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>_>
                      )vertices.
                       super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<CMU462::Vector3D_*,_std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>_>
                      )vertices.
                       super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                     (local_2b0->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_start);
          local_2d0 = lVar18;
        }
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,"NORMAL");
        if (bVar6) {
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::find(&arr_sources._M_t,&s);
          if ((_Rb_tree_header *)iVar15._M_node == &arr_sources._M_t._M_impl.super__Rb_tree_header)
          goto LAB_00175933;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[](&arr_sources,&s);
          pfVar2 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pfVar3 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar19 < (ulong)((long)pfVar2 - (long)pfVar3 >> 2); uVar19 = uVar19 + 3)
          {
            pfVar4 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_2b8 = (pointer)(double)pfVar4[uVar19 + 2];
            uVar1 = *(undefined8 *)(pfVar4 + uVar19);
            dStack_2c0 = (double)(float)((ulong)uVar1 >> 0x20);
            _f = (pointer)(double)(float)uVar1;
            std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                      (&polymesh->normals,(value_type *)&f);
          }
          bVar8 = true;
          local_250 = lVar18;
        }
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,"TEXCOORD");
        if (bVar6) {
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::find(&arr_sources._M_t,&s);
          if ((_Rb_tree_header *)iVar15._M_node == &arr_sources._M_t._M_impl.super__Rb_tree_header)
          goto LAB_00175933;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[](&arr_sources,&s);
          pfVar2 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pfVar3 = (pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar19 < (ulong)((long)pfVar2 - (long)pfVar3 >> 2); uVar19 = uVar19 + 2)
          {
            uVar1 = *(undefined8 *)
                     ((pmVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar19);
            dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
            unique0x10000366 = SUB84(dVar5,0);
            _f = (pointer)(double)(float)uVar1;
            unique0x1000036a = (int)((ulong)dVar5 >> 0x20);
            std::vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>::push_back
                      (&polymesh->texcoords,(value_type *)&f);
          }
          cVar9 = '\x01';
          local_258 = lVar18;
        }
        pXVar12 = tinyxml2::XMLNode::NextSiblingElement(&pXVar12->super_XMLNode,"input");
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::string::~string((string *)&ss);
      }
      iVar10 = tinyxml2::XMLElement::IntAttribute(pXVar11,"count");
      _f = ZEXT816(0);
      local_2b8 = (pointer)0x0;
      pXVar12 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"vcount");
      if (pXVar12 != (XMLElement *)0x0) {
        pcVar13 = tinyxml2::XMLElement::GetText(pXVar12);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,pcVar13,(allocator<char> *)&ss);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&s,_S_out|_S_in);
        __new_size = (size_type)iVar10;
        bVar17 = cVar9 + bVar8 + bVar23;
        lVar18 = 0;
        sVar21 = __new_size;
        while (bVar6 = sVar21 != 0, sVar21 = sVar21 - 1, bVar6) {
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&f,
                     (value_type_conflict1 *)&indices);
          lVar18 = lVar18 + (long)indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start * (ulong)bVar17;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::__cxx11::string::~string((string *)&s);
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"p");
        if (pXVar11 != (XMLElement *)0x0) {
          pcVar13 = tinyxml2::XMLElement::GetText(pXVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&s,pcVar13,(allocator<char> *)&ss);
          std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&s,_S_out|_S_in);
          while (bVar6 = lVar18 != 0, lVar18 = lVar18 + -1, bVar6) {
            std::istream::_M_extract<unsigned_long>((ulong *)&ss);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&indices,&index);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::__cxx11::string::~string((string *)&s);
          this_00 = &polymesh->polygons;
          std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::resize
                    (this_00,__new_size);
          if (bVar23) {
            uVar19 = (ulong)((uint)bVar17 * 8);
            pvVar16 = (vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x0;
            for (sVar21 = 0; sVar21 != __new_size; sVar21 = sVar21 + 1) {
              lVar18 = uVar19 * (long)pvVar16 + local_2d0 * 8;
              local_2b0 = pvVar16;
              for (uVar22 = 0; uVar22 < _f[sVar21]; uVar22 = uVar22 + 1) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&(this_00->
                            super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                            )._M_impl.super__Vector_impl_data._M_start[sVar21].vertex_indices,
                           (value_type_conflict1 *)
                           ((long)indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar18));
                lVar18 = lVar18 + uVar19;
              }
              pvVar16 = (vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                        ((long)&(local_2b0->
                                super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar22);
            }
          }
          if (bVar8) {
            uVar19 = (ulong)((uint)bVar17 * 8);
            lVar18 = 0;
            for (sVar21 = 0; sVar21 != __new_size; sVar21 = sVar21 + 1) {
              lVar20 = uVar19 * lVar18 + local_250 * 8;
              for (uVar22 = 0; uVar22 < _f[sVar21]; uVar22 = uVar22 + 1) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&(this_00->
                            super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                            )._M_impl.super__Vector_impl_data._M_start[sVar21].normal_indices,
                           (value_type_conflict1 *)
                           ((long)indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar20));
                lVar20 = lVar20 + uVar19;
              }
              lVar18 = lVar18 + uVar22;
            }
            lVar18 = 0;
            for (sVar21 = 0; sVar21 != __new_size; sVar21 = sVar21 + 1) {
              lVar20 = (ulong)bVar17 * 8 * lVar18 + local_258 * 8;
              for (uVar19 = 0; uVar19 < _f[sVar21]; uVar19 = uVar19 + 1) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&(this_00->
                            super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                            )._M_impl.super__Vector_impl_data._M_start[sVar21].texcoord_indices,
                           (value_type_conflict1 *)
                           ((long)indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar20));
                lVar20 = lVar20 + (ulong)bVar17 * 8;
              }
              lVar18 = lVar18 + uVar19;
            }
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&f);
          goto LAB_001758fd;
        }
      }
    }
  }
LAB_00175933:
  exit(1);
}

Assistant:

void ColladaParser::parse_polymesh(XMLElement* xml, PolymeshInfo& polymesh) {

  // name & id
  polymesh.id   = xml->Attribute( "id" );
  polymesh.name = xml->Attribute("name");
  polymesh.type = Instance::POLYMESH;

  XMLElement* e_mesh = xml->FirstChildElement("mesh");
  if (!e_mesh) {
    stat("Error: no mesh data defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  }

  // array sources
  map< string, vector<float> > arr_sources;
  XMLElement* e_source = e_mesh->FirstChildElement("source");
  while (e_source) {

    // source id
    string source_id = e_source->Attribute("id");

    // source float array - other formats not handled
    XMLElement* e_float_array = e_source->FirstChildElement("float_array");
    if (e_float_array) {

      float f; vector<float> floats;

      // load float array string
      string s = e_float_array->GetText();
      stringstream ss (s);

      // load float array
      size_t num_floats = e_float_array->IntAttribute("count");
      for (size_t i = 0; i < num_floats; ++i) {
        ss >> f; floats.push_back(f);
      }

      // add to array sources
      arr_sources[source_id] = floats;
    }

    // parse next source
    e_source = e_source->NextSiblingElement("source");
  }

  // vertices
  vector<Vector3D> vertices; string vertices_id;
  XMLElement* e_vertices = e_mesh->FirstChildElement("vertices");
  if (!e_vertices) {
    stat("Error: no vertices defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  } else {
    vertices_id = e_vertices->Attribute("id");
  }

  XMLElement* e_input = e_vertices->FirstChildElement("input");
  while (e_input) {

    // input semantic
    string semantic = e_input->Attribute("semantic");

    // semantic - position
    if (semantic == "POSITION") {
      string source = e_input->Attribute("source") + 1;
      if (arr_sources.find(source) != arr_sources.end()) {
        vector<float>& floats = arr_sources[source];
        size_t num_floats = floats.size();
        for (size_t i = 0; i < num_floats; i += 3) {
          Vector3D v = Vector3D(floats[i], floats[i+1], floats[i+2]);
          vertices.push_back(v);
        }
      } else {
        stat("Error: undefined input source: " << source);
        exit(EXIT_FAILURE);
      }
    }

    // NOTE (sky) : only positions are handled currently

    e_input = e_input->NextSiblingElement("input");
  }

  // polylist
  XMLElement* e_polylist = e_mesh->FirstChildElement("polylist");
  if (e_polylist) {

    // input arrays & array offsets
    bool has_vertex_array   = false; size_t vertex_offset   = 0;
    bool has_normal_array   = false; size_t normal_offset   = 0;
    bool has_texcoord_array = false; size_t texcoord_offset = 0;

    // input arr_sources
    XMLElement* e_input = e_polylist->FirstChildElement("input");
    while (e_input) {

      string semantic = e_input->Attribute("semantic");
      string source   = e_input->Attribute("source") + 1;
      size_t offset   = e_input->IntAttribute("offset");

      // vertex array source
      if (semantic == "VERTEX") {

        has_vertex_array = true;
        vertex_offset = offset;

        if (source == vertices_id) {
          polymesh.vertices.resize(vertices.size());
          copy(vertices.begin(), vertices.end(), polymesh.vertices.begin());
        } else {
          stat("Error: undefined source for VERTEX semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // normal array source
      if (semantic == "NORMAL") {

        has_normal_array = true;
        normal_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 3) {
            Vector3D n = Vector3D(floats[i], floats[i+1], floats[i+2]);
            polymesh.normals.push_back(n);
          }
        } else {
          stat("Error: undefined source for NORMAL semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // texcoord array source
      if (semantic == "TEXCOORD") {

        has_texcoord_array = true;
        texcoord_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 2) {
            Vector2D n = Vector2D(floats[i], floats[i+1]);
            polymesh.texcoords.push_back(n);
          }
        } else {
          stat("Error: undefined source for TEXCOORD semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      e_input = e_input->NextSiblingElement("input");
    }

    // polygon info
    size_t num_polygons = e_polylist->IntAttribute("count");
    size_t stride = ( has_vertex_array   ? 1 : 0 ) +
                    ( has_normal_array   ? 1 : 0 ) +
                    ( has_texcoord_array ? 1 : 0 ) ;

    // create polygon size array and compute size of index array
    vector<size_t> sizes; size_t num_indices = 0;
    XMLElement* e_vcount = e_polylist->FirstChildElement("vcount");
    if (e_vcount) {

      size_t size;
      string s = e_vcount->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_polygons; ++i) {
        ss >> size;
        sizes.push_back(size);
        num_indices += size * stride;
      }

    } else {
      stat("Error: polygon sizes undefined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // index array
    vector<size_t> indices;
    XMLElement* e_p = e_polylist->FirstChildElement("p");
    if (e_p) {

      size_t index;
      string s = e_p->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_indices; ++i) {
        ss >> index;
        indices.push_back(index);
      }

    } else {
      stat("Error: no index array defined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // create polygons
    polymesh.polygons.resize(num_polygons);

    // vertex array indices
    if (has_vertex_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].vertex_indices.push_back(
            indices[k * stride + vertex_offset]
          );
          k++;
        }
      }
    }

    // normal array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].normal_indices.push_back(
            indices[k * stride + normal_offset]
          );
          k++;
        }
      }
    }

    // texcoord array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].texcoord_indices.push_back(
            indices[k * stride + texcoord_offset]
          );
          k++;
        }
      }
    }

  }

  // print summary
  stat("  |- " << polymesh);
}